

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::cose::Sign1Message::AddAttribute
          (Error *__return_storage_ptr__,Sign1Message *this,int key,int value,int flags)

{
  char *pcVar1;
  cn_cbor *value_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *from;
  bool bVar3;
  format_args args;
  writer write;
  string local_b0;
  writer local_90;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  parse_func local_60 [1];
  ErrorCode local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  value_00 = cn_cbor_int_create((long)value,(cn_cbor_errback *)0x0);
  if (value_00 == (cn_cbor *)0x0) {
    local_88._0_4_ = none_type;
    from = "add COSE SIGN1 message attribute";
    local_80._M_p = "add COSE SIGN1 message attribute";
    local_78 = 0x20;
    local_70._M_allocated_capacity = 0;
    local_60[0] = (parse_func)0x0;
    local_90.handler_ = (format_string_checker<char> *)local_88;
    local_70._8_8_ = (format_string_checker<char> *)local_88;
    do {
      if (from == "") break;
      to = from;
      if (*from == '{') {
LAB_00182931:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_90,from,to);
        from = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (to,"",(format_string_checker<char> *)local_88);
        bVar3 = true;
      }
      else {
        to = from + 1;
        bVar3 = to != "";
        if (bVar3) {
          if (*to != '{') {
            pcVar1 = from + 2;
            do {
              to = pcVar1;
              bVar3 = to != "";
              if (to == "") goto LAB_0018292d;
              pcVar1 = to + 1;
            } while (*to != '{');
          }
          bVar3 = true;
        }
LAB_0018292d:
        if (bVar3) goto LAB_00182931;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_90,from,"");
        bVar3 = false;
      }
    } while (bVar3);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_88;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"add COSE SIGN1 message attribute",(string_view)ZEXT816(0x20),args);
    local_58 = kOutOfMemory;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    __return_storage_ptr__->mCode = local_58;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    paVar2 = &local_b0.field_2;
  }
  else {
    AddAttribute((Error *)local_88,this,key,value_00,flags);
    __return_storage_ptr__->mCode = local_88._0_4_;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_80)
    ;
    paVar2 = &local_70;
    local_b0._M_dataplus._M_p = local_80._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((value_00 != (cn_cbor *)0x0) && (value_00->parent == (cn_cbor *)0x0)) {
    cn_cbor_free(value_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::AddAttribute(int key, int value, int flags)
{
    Error    error;
    cn_cbor *cbor;

    cbor = cn_cbor_int_create(value, nullptr);
    VerifyOrExit(cbor != nullptr, error = ERROR_OUT_OF_MEMORY("add COSE SIGN1 message attribute"));

    SuccessOrExit(error = AddAttribute(key, cbor, flags));

exit:
    if (cbor != nullptr && cbor->parent == nullptr)
    {
        cn_cbor_free(cbor);
    }
    return error;
}